

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

void Lms_ManPrepare(Lms_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  Vec_Wrd_t *pVVar6;
  Vec_Str_t *pVVar7;
  int Best;
  int iVar8;
  int i;
  long lVar9;
  
  if (p->fLibConstr != 0) {
    __assert_fail("!p->fLibConstr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x184,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  if (p->vTruthPo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vTruthPo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x185,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  pVVar4 = Vec_IntStartFull(p->vTtMem->nEntries + 1);
  p->vTruthPo = pVVar4;
  pVVar4 = p->vTruthIds;
  uVar5 = (ulong)pVVar4->nSize;
  if (uVar5 == 0) {
    iVar8 = 0;
  }
  else {
    piVar1 = pVVar4->pArray;
    iVar8 = *piVar1;
    iVar2 = iVar8;
    for (lVar9 = 1; lVar9 < (long)uVar5; lVar9 = lVar9 + 1) {
      if (piVar1[lVar9] <= iVar2) {
        iVar2 = piVar1[lVar9];
      }
    }
    if (iVar2 < 0) {
      __assert_fail("Vec_IntFindMin(p->vTruthIds) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0x187,"void Lms_ManPrepare(Lms_Man_t *)");
    }
    for (lVar9 = 1; lVar9 < (long)uVar5; lVar9 = lVar9 + 1) {
      if (iVar8 <= piVar1[lVar9]) {
        iVar8 = piVar1[lVar9];
      }
    }
  }
  if (p->vTtMem->nEntries <= iVar8) {
    __assert_fail("Vec_IntFindMax(p->vTruthIds) < Vec_MemEntryNum(p->vTtMem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x188,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  for (iVar8 = 0; iVar8 < (int)uVar5; iVar8 = iVar8 + 1) {
    iVar2 = Vec_IntEntry(pVVar4,iVar8);
    iVar3 = Vec_IntEntry(p->vTruthPo,iVar2);
    if (iVar3 == -1) {
      Vec_IntWriteEntry(p->vTruthPo,iVar2,iVar8);
    }
    pVVar4 = p->vTruthIds;
    uVar5 = (ulong)(uint)pVVar4->nSize;
  }
  Vec_IntWriteEntry(p->vTruthPo,p->vTtMem->nEntries,p->pGia->vCos->nSize);
  if (p->vDelays == (Vec_Wrd_t *)0x0) {
    if (p->vAreas != (Vec_Str_t *)0x0) {
      __assert_fail("p->vAreas == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,399,"void Lms_ManPrepare(Lms_Man_t *)");
    }
    if (p->vFreqs == (Vec_Int_t *)0x0) {
      pVVar6 = Lms_GiaDelays(p->pGia);
      p->vDelays = pVVar6;
      pVVar7 = Lms_GiaAreas(p->pGia);
      p->vAreas = pVVar7;
      pVVar4 = Vec_IntStart(p->pGia->vCos->nSize);
      p->vFreqs = pVVar4;
      return;
    }
    __assert_fail("p->vFreqs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,400,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  __assert_fail("p->vDelays == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                ,0x18e,"void Lms_ManPrepare(Lms_Man_t *)");
}

Assistant:

void Lms_ManPrepare( Lms_Man_t * p )
{
    // compute the first PO for each semi-canonical form
    int i, Entry;
    assert( !p->fLibConstr );
    assert( p->vTruthPo == NULL );
    p->vTruthPo = Vec_IntStartFull( Vec_MemEntryNum(p->vTtMem)+1 );
    assert( Vec_IntFindMin(p->vTruthIds) >= 0 );
    assert( Vec_IntFindMax(p->vTruthIds) < Vec_MemEntryNum(p->vTtMem) );
    Vec_IntForEachEntry( p->vTruthIds, Entry, i )
        if ( Vec_IntEntry(p->vTruthPo, Entry) == -1 )
            Vec_IntWriteEntry( p->vTruthPo, Entry, i );
    Vec_IntWriteEntry( p->vTruthPo, Vec_MemEntryNum(p->vTtMem), Gia_ManCoNum(p->pGia) );
    // compute delay/area and init frequency
    assert( p->vDelays == NULL );
    assert( p->vAreas == NULL );
    assert( p->vFreqs == NULL );
    p->vDelays = Lms_GiaDelays( p->pGia );
    p->vAreas  = Lms_GiaAreas( p->pGia );
    p->vFreqs  = Vec_IntStart( Gia_ManCoNum(p->pGia) );
}